

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_sv.c
# Opt level: O0

adt_str_t * dtl_sv_to_str(dtl_sv_t *self,_Bool *ok)

{
  adt_str_t *local_20;
  adt_str_t *str;
  _Bool *ok_local;
  dtl_sv_t *self_local;
  
  local_20 = (adt_str_t *)0x0;
  if ((self != (dtl_sv_t *)0x0) && (local_20 = adt_str_new(), local_20 != (adt_str_t *)0x0)) {
    dtl_sv_to_string_internal(self,local_20,ok);
  }
  return local_20;
}

Assistant:

adt_str_t* dtl_sv_to_str(const dtl_sv_t *self, bool* ok)
{
   adt_str_t *str = (adt_str_t*) 0;
   if(self != 0)
   {
      str = adt_str_new();
      if (str != 0)
      {
         dtl_sv_to_string_internal(self, str, ok);
      }
   }
   return str;
}